

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

uint mp_hs_integer(mp_int *x,uintmax_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  BignumInt BVar5;
  
  uVar1 = x->nw;
  uVar2 = ~n;
  uVar4 = 1;
  uVar3 = 0;
  do {
    if (uVar3 < uVar1) {
      BVar5 = x->w[uVar3];
    }
    else {
      BVar5 = 0;
    }
    uVar4 = (ulong)CARRY8(uVar2,uVar4) + (ulong)CARRY8(uVar2 + uVar4,BVar5);
    uVar3 = uVar3 + 1;
    uVar2 = 0xffffffffffffffff;
  } while (uVar1 + (uVar1 == 0) != uVar3);
  return (uint)uVar4;
}

Assistant:

unsigned mp_hs_integer(mp_int *x, uintmax_t n)
{
    BignumInt carry = 1;
    size_t nwords = sizeof(n)/BIGNUM_INT_BYTES;
    for (size_t i = 0, e = size_t_max(x->nw, nwords); i < e; i++) {
        BignumInt nword = n;
        n = shift_right_by_one_word(n);
        BignumInt dummy_out;
        BignumADC(dummy_out, carry, mp_word(x, i), ~nword, carry);
        (void)dummy_out;
    }
    return carry;
}